

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

shared_ptr<Liby::UdpSocket> __thiscall Liby::EventLoopGroup::creatUdpClient(EventLoopGroup *this)

{
  int fd;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  EventLoopGroup *in_RSI;
  shared_ptr<Liby::UdpSocket> sVar2;
  shared_ptr<Liby::Socket> local_48;
  undefined1 local_29;
  undefined1 local_28 [8];
  SockPtr sockPtr;
  EventLoopGroup *this_local;
  shared_ptr<Liby::UdpSocket> *udpSocket;
  
  local_29 = 1;
  std::make_shared<Liby::Socket,bool>((bool *)local_28);
  peVar1 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_28);
  Socket::setNoblock(peVar1,true);
  local_48.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0;
  peVar1 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_28);
  fd = Socket::fd(peVar1);
  local_48.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)robinLoop1(in_RSI,fd);
  std::make_shared<Liby::UdpSocket,Liby::EventLoop*,std::shared_ptr<Liby::Socket>&>
            ((EventLoop **)this,&local_48);
  local_48.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1;
  std::shared_ptr<Liby::Socket>::~shared_ptr((shared_ptr<Liby::Socket> *)local_28);
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket> EventLoopGroup::creatUdpClient() {
    SockPtr sockPtr = std::make_shared<Socket>(true);
    sockPtr->setNoblock();
    std::shared_ptr<UdpSocket> udpSocket =
        std::make_shared<UdpSocket>(robinLoop1(sockPtr->fd()), sockPtr);
    return udpSocket;
}